

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<long>::ExtractSubrange
          (RepeatedField<long> *this,int start,int num,long *elements)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (elements != (long *)0x0) {
    uVar3 = 0;
    uVar5 = 0;
    if (0 < num) {
      uVar5 = (ulong)(uint)num;
    }
    pvVar2 = this->arena_or_elements_;
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      elements[uVar3] = *(long *)((long)pvVar2 + uVar3 * 8 + (long)start * 8);
    }
  }
  if (0 < num) {
    iVar1 = this->current_size_;
    pvVar2 = this->arena_or_elements_;
    for (lVar4 = (long)(start + num); lVar4 < iVar1; lVar4 = lVar4 + 1) {
      *(undefined8 *)((long)pvVar2 + lVar4 * 8 + (ulong)(uint)num * -8) =
           *(undefined8 *)((long)pvVar2 + lVar4 * 8);
    }
    if (0 < iVar1) {
      this->current_size_ = iVar1 - num;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}